

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite_command.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  long lVar2;
  BankAccount ba;
  int local_a4 [3];
  shared_ptr<ICommand> local_98;
  BankAccount local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  CommandList commands;
  BankAccount local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  BankAccount local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  initializer_list<std::shared_ptr<ICommand>_> local_38;
  
  local_a4[2] = 0;
  ba.balance = 1000;
  ba.overdraft_limit = -500;
  local_a4[1] = 100;
  std::make_shared<Command,BankAccount&,Command::Action,int>(&local_48,(Action *)&ba,local_a4 + 2);
  local_98.super___shared_ptr<ICommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_48;
  local_98.super___shared_ptr<ICommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_40._M_pi;
  local_48.balance = 0;
  local_48.overdraft_limit = 0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a4[0] = 1;
  std::make_shared<Command,BankAccount&,Command::Action,int>(&local_58,(Action *)&ba,local_a4);
  local_38._M_array = &local_98;
  local_88 = local_58;
  p_Stack_80 = _Stack_50._M_pi;
  local_58.balance = 0;
  local_58.overdraft_limit = 0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38._M_len = 2;
  CommandList::CommandList(&commands,&local_38);
  lVar2 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_98.super___shared_ptr<ICommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
               lVar2));
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != -8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,ba.balance);
  std::endl<char,std::char_traits<char>>(poVar1);
  CommandList::invoke(&commands);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,ba.balance);
  std::endl<char,std::char_traits<char>>(poVar1);
  CommandList::undo(&commands);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,ba.balance);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::vector<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_>::~vector
            (&commands.
              super_vector<std::shared_ptr<ICommand>,_std::allocator<std::shared_ptr<ICommand>_>_>);
  return 0;
}

Assistant:

int main()
{
	BankAccount ba{1000};
	CommandList commands{
		std::make_shared<Command>(ba, Command::Action::Deposit, 100),
		std::make_shared<Command>(ba, Command::Action::Withdraw, 200),
	};

	std::cout << ba.balance << std::endl;
	commands.invoke();
	std::cout << ba.balance << std::endl;
	commands.undo();
	std::cout << ba.balance << std::endl;

	return 0;
}